

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getCostsTimeRanges(OptimalControlProblem *this)

{
  undefined8 *puVar1;
  size_type __new_size;
  pointer pTVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  OptimalControlProblemPimpl *pOVar5;
  long lVar6;
  
  pOVar5 = this->m_pimpl;
  __new_size = (pOVar5->costs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (((long)(pOVar5->costTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pOVar5->costTimeRanges).
            super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18 != __new_size) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pOVar5->costTimeRanges,__new_size);
    pOVar5 = this->m_pimpl;
  }
  p_Var4 = (pOVar5->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar6 = 0;
  while ((_Rb_tree_header *)p_Var4 != &(pOVar5->costs)._M_t._M_impl.super__Rb_tree_header) {
    pTVar2 = (this->m_pimpl->costTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (&pTVar2->m_anyTime)[lVar6] = SUB41(p_Var4[9]._M_color,0);
    p_Var3 = p_Var4[8]._M_right;
    puVar1 = (undefined8 *)((long)&pTVar2->m_initTime + lVar6);
    *puVar1 = p_Var4[8]._M_left;
    puVar1[1] = p_Var3;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    lVar6 = lVar6 + 0x18;
  }
  return &this->m_pimpl->costTimeRanges;
}

Assistant:

std::vector<TimeRange> &OptimalControlProblem::getCostsTimeRanges() const
        {
            if (m_pimpl->costTimeRanges.size() != m_pimpl->costs.size()) {
                m_pimpl->costTimeRanges.resize(m_pimpl->costs.size());
            }

            size_t i = 0;
            for (auto& c : m_pimpl->costs){
                m_pimpl->costTimeRanges[i] = c.second.timeRange;
                ++i;
            }
            return m_pimpl->costTimeRanges;
        }